

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack16.h
# Opt level: O3

void ncnn::conv3x3s1_winograd63_pack16_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  int *piVar1;
  int iVar2;
  int _h;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  size_t _elemsize;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  Option *opt_00;
  long lVar16;
  int w_tiles;
  Mat *pMVar17;
  long lVar18;
  undefined1 (*pauVar19) [64];
  int iVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  long local_e60;
  long local_e58;
  long local_e40;
  Mat *local_e38;
  size_t local_e30;
  int local_e24;
  Mat local_e20;
  Mat *local_dd0;
  ulong local_dc8;
  Mat local_dc0;
  long local_d78;
  long local_d70;
  long local_d68;
  long local_d60;
  long local_d58;
  long local_d50;
  long local_d48;
  ulong local_d40;
  void *local_d38;
  long local_d30;
  Mat *local_d28;
  Mat local_d20;
  Mat local_cd0;
  undefined1 auStack_c80 [512];
  undefined1 auStack_a80 [512];
  undefined1 auStack_880 [512];
  undefined1 auStack_680 [512];
  undefined1 auStack_480 [512];
  undefined1 auStack_280 [512];
  undefined1 auStack_80 [80];
  
  iVar20 = bottom_blob->c;
  local_e30 = bottom_blob->elemsize;
  iVar12 = bottom_blob->elempack;
  iVar21 = top_blob->w;
  iVar13 = top_blob->h;
  iVar15 = top_blob->c;
  piVar1 = bottom_blob->refcount;
  local_dc0.data = bottom_blob->data;
  local_dc0.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_dc0.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_dc0.elemsize._0_4_ = (undefined4)local_e30;
  local_dc0.elemsize._4_4_ = (undefined4)(local_e30 >> 0x20);
  local_dc0.allocator = bottom_blob->allocator;
  iVar14 = bottom_blob->h;
  uVar3 = bottom_blob->dims;
  uVar4 = bottom_blob->w;
  uVar5 = bottom_blob->h;
  uVar6 = bottom_blob->d;
  iVar11 = bottom_blob->w;
  local_dc0.cstep = bottom_blob->cstep;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    iVar11 = bottom_blob->w;
    iVar14 = bottom_blob->h;
  }
  iVar21 = (iVar21 + 5) / 6;
  iVar2 = iVar21 * 6;
  iVar13 = (iVar13 + 5) / 6;
  _h = iVar13 * 6;
  local_e40 = CONCAT44(local_e40._4_4_,iVar2);
  local_e38 = kernel_tm;
  local_dd0 = top_blob;
  local_dc0.elempack = iVar12;
  local_dc0.dims = uVar3;
  local_dc0.w = uVar4;
  local_dc0.h = uVar5;
  local_dc0.d = uVar6;
  local_dc0.c = iVar20;
  copy_make_border(bottom_blob,&local_dc0,0,(_h - iVar14) + 2,0,(iVar2 - iVar11) + 2,0,0.0,opt);
  _elemsize = local_e30;
  local_cd0.cstep = 0;
  local_cd0.data = (void *)0x0;
  local_cd0.refcount._0_4_ = 0;
  local_cd0.refcount._4_4_ = 0;
  local_cd0.elemsize._0_4_ = 0;
  local_cd0._20_8_ = 0;
  local_cd0.allocator = (Allocator *)0x0;
  local_cd0.dims = 0;
  local_cd0.w = 0;
  local_cd0.h = 0;
  local_cd0.d = 0;
  local_cd0.c = 0;
  Mat::create(&local_cd0,iVar13 * iVar21,0x40,iVar20,local_e30,iVar12,opt->workspace_allocator);
  conv3x3s1_winograd63_transform_input_pack16_avx512(&local_dc0,&local_cd0,opt_00);
  pMVar17 = local_dd0;
  piVar1 = (int *)CONCAT44(local_dc0.refcount._4_4_,local_dc0.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_dc0.allocator == (Allocator *)0x0) {
        if (local_dc0.data != (void *)0x0) {
          free(local_dc0.data);
        }
      }
      else {
        (*(local_dc0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_dc0.cstep = 0;
  local_dc0.data = (void *)0x0;
  local_dc0.refcount._0_4_ = 0;
  local_dc0.refcount._4_4_ = 0;
  local_dc0.elemsize._0_4_ = 0;
  local_dc0.elemsize._4_4_ = 0;
  local_dc0.elempack = 0;
  local_dc0.h = 0;
  local_dc0.d = 0;
  local_dc0.c = 0;
  local_dc0.allocator = (Allocator *)0x0;
  local_dc0.dims = 0;
  local_dc0.w = 0;
  local_d20.cstep = 0;
  local_d20.data = (void *)0x0;
  local_d20.refcount._0_4_ = 0;
  local_d20.refcount._4_4_ = 0;
  local_d20.elemsize._0_4_ = 0;
  local_d20.elemsize._4_4_ = 0;
  local_d20.elempack = 0;
  local_d20.allocator = (Allocator *)0x0;
  local_d20.dims = 0;
  local_d20.w = 0;
  local_d20.h = 0;
  local_d20.d = 0;
  local_d20.c = 0;
  convolution_winograd_dot_pack16_avx512(&local_cd0,iVar15,local_e38,&local_d20,opt);
  local_e20.cstep = 0;
  local_e20.data = (void *)0x0;
  local_e20.refcount._0_4_ = 0;
  local_e20.refcount._4_4_ = 0;
  local_e20.elemsize._0_4_ = 0;
  local_e20.elemsize._4_4_ = 0;
  local_e20.elempack = 0;
  local_e20.allocator = (Allocator *)0x0;
  local_e20.dims = 0;
  local_e20.w = 0;
  local_e20.h = 0;
  local_e20.d = 0;
  local_e20.c = 0;
  if (((int)local_e40 == pMVar17->w) && (_h == pMVar17->h)) {
    if (&local_e20 == pMVar17) {
      iVar21 = 0;
      iVar13 = 0;
      goto LAB_001d7fe6;
    }
    piVar1 = pMVar17->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_e20.data = pMVar17->data;
    local_e20.refcount._0_4_ = SUB84(pMVar17->refcount,0);
    local_e20.refcount._4_4_ = (undefined4)((ulong)pMVar17->refcount >> 0x20);
    local_e20.elemsize._0_4_ = (undefined4)pMVar17->elemsize;
    local_e20.elemsize._4_4_ = (undefined4)(pMVar17->elemsize >> 0x20);
    local_e20.elempack = pMVar17->elempack;
    local_e20.allocator = pMVar17->allocator;
    uVar7 = pMVar17->dims;
    uVar8 = pMVar17->w;
    uVar9 = pMVar17->h;
    uVar10 = pMVar17->d;
    local_e20.c = pMVar17->c;
    local_e20.cstep = pMVar17->cstep;
    iVar20 = pMVar17->w;
    iVar12 = pMVar17->h;
    local_e20.dims = uVar7;
    local_e20.w = uVar8;
    local_e20.h = uVar9;
    local_e20.d = uVar10;
  }
  else {
    Mat::create(&local_e20,(int)local_e40,_h,iVar15,_elemsize,iVar12,opt->workspace_allocator);
    iVar20 = local_e20.w;
    iVar12 = local_e20.h;
  }
  iVar21 = iVar20;
  iVar13 = iVar12;
  if (0 < local_e20.c) {
    local_d38 = bias->data;
    local_d28 = (Mat *)(ulong)(uint)(iVar12 / 6);
    local_e30 = (size_t)(uint)(iVar20 / 6);
    iVar15 = (iVar20 / 6) * (iVar12 / 6);
    local_d40 = (ulong)(uint)local_e20.c;
    local_d30 = local_e30 * 0x40;
    local_d48 = (long)(iVar15 * 0x10) * 4;
    local_d50 = (long)(iVar15 * 0x20) * 4;
    local_d58 = (long)(iVar15 * 0x30) * 4;
    local_d60 = (long)(iVar15 * 0x40) * 4;
    local_d68 = (long)(iVar15 * 0x50) * 4;
    local_d70 = (long)(iVar15 * 0x60) * 4;
    local_d78 = (long)(iVar15 * 0x70) * 4;
    auVar25 = vbroadcastss_avx512f(ZEXT416(0x42000000));
    auVar26 = vbroadcastss_avx512f(ZEXT416(0x40800000));
    auVar27 = vbroadcastss_avx512f(ZEXT416(0x41000000));
    auVar28 = vbroadcastss_avx512f(ZEXT416(0x41800000));
    auVar29 = vbroadcastss_avx512f(ZEXT416(0x40000000));
    uVar22 = 0;
    do {
      local_dc8 = uVar22;
      if (local_d38 == (void *)0x0) {
        auVar38 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
        auVar38 = *(undefined1 (*) [64])((long)local_d38 + local_dc8 * 0x40);
      }
      if (5 < iVar12) {
        lVar24 = CONCAT44(local_d20.elemsize._4_4_,(undefined4)local_d20.elemsize) * local_d20.cstep
                 * local_dc8;
        local_e60 = (long)local_e20.data +
                    local_e20.cstep *
                    CONCAT44(local_e20.elemsize._4_4_,(undefined4)local_e20.elemsize) * local_dc8 +
                    0x140;
        local_e40 = (long)local_e20.w *
                    CONCAT44(local_e20.elemsize._4_4_,(undefined4)local_e20.elemsize) * 6;
        local_e58 = 0;
        pMVar17 = (Mat *)0x0;
        do {
          local_e38 = pMVar17;
          if (5 < iVar20) {
            uVar22 = 0;
            lVar23 = local_e58;
            do {
              lVar16 = -0x200;
              lVar18 = lVar23;
              do {
                auVar31 = *(undefined1 (*) [64])((long)local_d20.data + lVar18 + local_d48 + lVar24)
                ;
                auVar32 = *(undefined1 (*) [64])((long)local_d20.data + lVar18 + local_d50 + lVar24)
                ;
                auVar33 = *(undefined1 (*) [64])((long)local_d20.data + lVar18 + local_d58 + lVar24)
                ;
                auVar34 = *(undefined1 (*) [64])((long)local_d20.data + lVar18 + local_d60 + lVar24)
                ;
                auVar35 = *(undefined1 (*) [64])((long)local_d20.data + lVar18 + local_d68 + lVar24)
                ;
                auVar36 = *(undefined1 (*) [64])((long)local_d20.data + lVar18 + local_d70 + lVar24)
                ;
                auVar30 = vaddps_avx512f(auVar32,auVar31);
                auVar31 = vsubps_avx512f(auVar31,auVar32);
                auVar32 = vaddps_avx512f(auVar34,auVar33);
                auVar33 = vsubps_avx512f(auVar33,auVar34);
                auVar34 = vaddps_avx512f(auVar36,auVar35);
                auVar35 = vsubps_avx512f(auVar35,auVar36);
                auVar36 = vaddps_avx512f(auVar30,*(undefined1 (*) [64])
                                                  ((long)local_d20.data + lVar18 + lVar24));
                auVar37 = vfmadd213ps_avx512f(auVar25,auVar34,auVar32);
                auVar36 = vaddps_avx512f(auVar36,auVar37);
                auVar37 = vfmadd213ps_avx512f(auVar26,auVar32,auVar30);
                auVar37 = vfmadd231ps_avx512f(auVar37,auVar34,auVar27);
                auVar32 = vfmadd213ps_avx512f(auVar32,auVar28,auVar30);
                auVar30 = vaddps_avx512f(auVar31,*(undefined1 (*) [64])
                                                  ((long)local_d20.data +
                                                  lVar18 + local_d78 + lVar24));
                auVar32 = vfmadd231ps_avx512f(auVar32,auVar29,auVar34);
                *(undefined1 (*) [64])(auStack_a80 + lVar16) = auVar36;
                *(undefined1 (*) [64])(auStack_680 + lVar16) = auVar37;
                *(undefined1 (*) [64])(auStack_280 + lVar16) = auVar32;
                auVar32 = vfmadd213ps_avx512f(auVar29,auVar33,auVar31);
                auVar32 = vfmadd231ps_avx512f(auVar32,auVar35,auVar28);
                auVar31 = vfmadd231ps_avx512f(auVar31,auVar33,auVar27);
                auVar31 = vfmadd231ps_avx512f(auVar31,auVar35,auVar26);
                auVar33 = vfmadd213ps_avx512f(auVar33,auVar25,auVar35);
                auVar33 = vaddps_avx512f(auVar30,auVar33);
                *(undefined1 (*) [64])(auStack_880 + lVar16) = auVar32;
                *(undefined1 (*) [64])(auStack_480 + lVar16) = auVar31;
                *(undefined1 (*) [64])(auStack_80 + lVar16) = auVar33;
                lVar18 = lVar18 + (long)(iVar15 * 0x80) * 4;
                lVar16 = lVar16 + 0x40;
              } while (lVar16 != 0);
              pauVar19 = (undefined1 (*) [64])(((long)((uVar22 << 0x25) * 3) >> 0x1e) + local_e60);
              lVar18 = 0x1c0;
              do {
                auVar31 = *(undefined1 (*) [64])((long)&local_e20.allocator + lVar18);
                auVar32 = *(undefined1 (*) [64])((long)&local_dc0.data + lVar18);
                auVar33 = *(undefined1 (*) [64])((long)&local_dc0.cstep + lVar18);
                auVar34 = *(undefined1 (*) [64])((long)&local_d20.allocator + lVar18);
                auVar35 = *(undefined1 (*) [64])((long)&local_cd0.elemsize + lVar18);
                auVar36 = vaddps_avx512f(auVar32,auVar31);
                auVar31 = vsubps_avx512f(auVar31,auVar32);
                auVar32 = vaddps_avx512f(*(undefined1 (*) [64])((long)&local_d40 + lVar18),auVar33);
                auVar33 = vsubps_avx512f(auVar33,*(undefined1 (*) [64])((long)&local_d40 + lVar18));
                auVar30 = vaddps_avx512f(auVar35,auVar34);
                auVar34 = vsubps_avx512f(auVar34,auVar35);
                auVar35 = vfmadd213ps_avx512f(auVar25,auVar30,auVar32);
                auVar37 = vaddps_avx512f(auVar38,*(undefined1 (*) [64])((long)&local_e40 + lVar18));
                auVar37 = vaddps_avx512f(auVar37,auVar36);
                auVar35 = vaddps_avx512f(auVar37,auVar35);
                auVar37 = vfmadd213ps_avx512f(auVar26,auVar32,auVar36);
                auVar37 = vfmadd231ps_avx512f(auVar37,auVar30,auVar27);
                auVar37 = vaddps_avx512f(auVar37,auVar38);
                auVar32 = vfmadd213ps_avx512f(auVar32,auVar28,auVar36);
                auVar32 = vfmadd231ps_avx512f(auVar32,auVar29,auVar30);
                auVar32 = vaddps_avx512f(auVar32,auVar38);
                auVar36 = vaddps_avx512f(auVar31,auVar38);
                auVar36 = vaddps_avx512f(auVar36,*(undefined1 (*) [64])(auStack_c80 + lVar18));
                pauVar19[-5] = auVar35;
                pauVar19[-3] = auVar37;
                pauVar19[-1] = auVar32;
                auVar32 = vfmadd213ps_avx512f(auVar29,auVar33,auVar31);
                auVar32 = vfmadd231ps_avx512f(auVar32,auVar34,auVar28);
                auVar32 = vaddps_avx512f(auVar32,auVar38);
                auVar31 = vfmadd231ps_avx512f(auVar31,auVar33,auVar27);
                auVar31 = vfmadd231ps_avx512f(auVar31,auVar34,auVar26);
                auVar31 = vaddps_avx512f(auVar31,auVar38);
                auVar33 = vfmadd213ps_avx512f(auVar33,auVar25,auVar34);
                auVar33 = vaddps_avx512f(auVar36,auVar33);
                pauVar19[-4] = auVar32;
                pauVar19[-2] = auVar31;
                *pauVar19 = auVar33;
                lVar18 = lVar18 + 0x200;
                pauVar19 = (undefined1 (*) [64])(*pauVar19 + (long)(iVar20 << 4) * 4);
              } while (lVar18 != 0xdc0);
              uVar22 = uVar22 + 1;
              lVar23 = lVar23 + 0x40;
            } while (uVar22 != local_e30);
          }
          pMVar17 = (Mat *)((long)&local_e38->data + 1);
          local_e58 = local_e58 + local_d30;
          local_e60 = local_e60 + local_e40;
        } while (pMVar17 != local_d28);
      }
      uVar22 = local_dc8 + 1;
      pMVar17 = local_dd0;
      iVar21 = local_e20.w;
      iVar13 = local_e20.h;
      local_e24 = iVar12;
    } while (local_dc8 + 1 != local_d40);
  }
LAB_001d7fe6:
  copy_cut_border(&local_e20,pMVar17,0,iVar13 - pMVar17->h,0,iVar21 - pMVar17->w,opt);
  piVar1 = (int *)CONCAT44(local_e20.refcount._4_4_,local_e20.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_e20.allocator == (Allocator *)0x0) {
        if (local_e20.data != (void *)0x0) {
          free(local_e20.data);
        }
      }
      else {
        (*(local_e20.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar1 = (int *)CONCAT44(local_d20.refcount._4_4_,local_d20.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_d20.allocator == (Allocator *)0x0) {
        if (local_d20.data != (void *)0x0) {
          free(local_d20.data);
        }
      }
      else {
        (*(local_d20.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar1 = (int *)CONCAT44(local_cd0.refcount._4_4_,local_cd0.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_cd0.allocator == (Allocator *)0x0) {
        if (local_cd0.data != (void *)0x0) {
          free(local_cd0.data);
        }
      }
      else {
        (*(local_cd0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar1 = (int *)CONCAT44(local_dc0.refcount._4_4_,local_dc0.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_dc0.allocator == (Allocator *)0x0) {
        if (local_dc0.data != (void *)0x0) {
          free(local_dc0.data);
        }
      }
      else {
        (*(local_dc0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_pack16_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 6n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 5) / 6 * 6;
    outh = (outh + 5) / 6 * 6;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 6;
        int h_tiles = outh / 6;
        const int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 64, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd63_transform_input_pack16_avx512(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_pack16_avx512(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, elemsize, elempack, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd63_transform_output_pack16_avx512(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}